

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O3

void __thiscall flow::TargetCodeGenerator::visit(TargetCodeGenerator *this,CallInstr *callInstr)

{
  iterator *piVar1;
  LiteralType LVar2;
  _Elt_pointer ppVVar3;
  iterator __position;
  pointer ppVVar4;
  Signature *pSVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  Value *local_38;
  
  ppVVar4 = (callInstr->super_Instr).operands_.
            super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar7 = (ulong)((long)(callInstr->super_Instr).operands_.
                        super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)ppVVar4) >> 3;
  iVar9 = (int)uVar7 + -1;
  if (0 < iVar9) {
    uVar8 = 1;
    do {
      emitLoad(this,(callInstr->super_Instr).operands_.
                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                    super__Vector_impl_data._M_start[uVar8]);
      uVar8 = uVar8 + 1;
    } while ((uVar7 & 0xffffffff) != uVar8);
    ppVVar4 = (callInstr->super_Instr).operands_.
              super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  pSVar5 = NativeCallback::signature((NativeCallback *)(*ppVVar4)[1]._vptr_Value);
  LVar2 = pSVar5->returnType_;
  sVar6 = ConstantPool::makeNativeFunction
                    (&this->cp_,
                     (IRBuiltinFunction *)
                     *(callInstr->super_Instr).operands_.
                      super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>._M_impl.
                      super__Vector_impl_data._M_start);
  emitInstr(this,CALL,(Operand)sVar6,
            (short)((uint)(*(int *)&(callInstr->super_Instr).operands_.
                                    super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                          *(int *)&(callInstr->super_Instr).operands_.
                                   super__Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>
                                   ._M_impl.super__Vector_impl_data._M_start) >> 3) - 1,
            (ushort)(LVar2 != Void));
  if (iVar9 != 0) {
    pop(this,(long)iVar9);
  }
  if (LVar2 != Void) {
    ppVVar3 = (this->stack_).
              super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur;
    if (ppVVar3 ==
        (this->stack_).super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
      local_38 = (Value *)callInstr;
      std::deque<flow::Value_const*,std::allocator<flow::Value_const*>>::
      _M_push_back_aux<flow::Value_const*const&>
                ((deque<flow::Value_const*,std::allocator<flow::Value_const*>> *)&this->stack_,
                 &local_38);
    }
    else {
      *ppVVar3 = (Value *)callInstr;
      piVar1 = &(this->stack_).
                super__Deque_base<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>._M_impl
                .super__Deque_impl_data._M_finish;
      piVar1->_M_cur = piVar1->_M_cur + 1;
    }
    if ((callInstr->super_Instr).super_Value.uses_.
        super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
        super__Vector_impl_data._M_start ==
        (callInstr->super_Instr).super_Value.uses_.
        super__Vector_base<flow::Instr_*,_std::allocator<flow::Instr_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_38 = (Value *)0x10002;
      __position._M_current =
           (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->code_,__position,
                   (unsigned_long *)&local_38);
      }
      else {
        *__position._M_current = 0x10002;
        (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      pop(this,1);
    }
  }
  return;
}

Assistant:

void TargetCodeGenerator::visit(CallInstr& callInstr) {
  const int argc = callInstr.operands().size() - 1;
  for (int i = 1; i <= argc; ++i)
    emitLoad(callInstr.operand(i));

  const bool returnsValue =
      callInstr.callee()->signature().returnType() != LiteralType::Void;

  emitInstr(Opcode::CALL,
      cp_.makeNativeFunction(callInstr.callee()),
      callInstr.operands().size() - 1,
      returnsValue ? 1 : 0);

  if (argc)
    pop(argc);

  if (returnsValue) {
    push(&callInstr);

    if (!callInstr.isUsed()) {
      emitInstr(Opcode::DISCARD, 1);
      pop(1);
    }
  }
}